

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

RuleBasedCollator * __thiscall
icu_63::RuleBasedNumberFormat::getCollator(RuleBasedNumberFormat *this)

{
  Collator *pCVar1;
  RuleBasedCollator *this_00;
  UnicodeString *pUVar2;
  UErrorCode status;
  UnicodeString rules;
  
  if (this->fRuleSets == (NFRuleSet **)0x0) {
    return (RuleBasedCollator *)0x0;
  }
  if (this->collator != (RuleBasedCollator *)0x0) {
    return this->collator;
  }
  if (this->lenient == '\0') {
    return (RuleBasedCollator *)0x0;
  }
  status = U_ZERO_ERROR;
  pCVar1 = Collator::createInstance(&this->locale,&status);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (pCVar1 == (Collator *)0x0) goto LAB_00219c2f;
    this_00 = (RuleBasedCollator *)
              __dynamic_cast(pCVar1,&Collator::typeinfo,&RuleBasedCollator::typeinfo,0);
    if (this_00 != (RuleBasedCollator *)0x0) {
      if (this->lenientParseRules == (UnicodeString *)0x0) {
        pCVar1 = (Collator *)0x0;
      }
      else {
        pUVar2 = RuleBasedCollator::getRules(this_00);
        UnicodeString::UnicodeString(&rules,pUVar2);
        pUVar2 = this->lenientParseRules;
        UnicodeString::append(&rules,pUVar2);
        this_00 = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x110,(size_t)pUVar2);
        if (this_00 == (RuleBasedCollator *)0x0) {
          UnicodeString::~UnicodeString(&rules);
          return (RuleBasedCollator *)0x0;
        }
        RuleBasedCollator::RuleBasedCollator(this_00,&rules,&status);
        UnicodeString::~UnicodeString(&rules);
        if (this_00 == (RuleBasedCollator *)0x0) {
          return (RuleBasedCollator *)0x0;
        }
        if (U_ZERO_ERROR < status) {
          (*(this_00->super_Collator).super_UObject._vptr_UObject[1])(this_00);
          goto LAB_00219b7f;
        }
      }
      (*(this_00->super_Collator).super_UObject._vptr_UObject[0x17])(this_00,4,0x11,&status);
      this->collator = this_00;
      goto LAB_00219b76;
    }
  }
  else {
LAB_00219b76:
    if (pCVar1 == (Collator *)0x0) goto LAB_00219c2f;
  }
LAB_00219b7f:
  (*(pCVar1->super_UObject)._vptr_UObject[1])(pCVar1);
LAB_00219c2f:
  return this->collator;
}

Assistant:

const RuleBasedCollator*
RuleBasedNumberFormat::getCollator() const
{
#if !UCONFIG_NO_COLLATION
    if (!fRuleSets) {
        return NULL;
    }

    // lazy-evaluate the collator
    if (collator == NULL && lenient) {
        // create a default collator based on the formatter's locale,
        // then pull out that collator's rules, append any additional
        // rules specified in the description, and create a _new_
        // collator based on the combination of those rules

        UErrorCode status = U_ZERO_ERROR;

        Collator* temp = Collator::createInstance(locale, status);
        RuleBasedCollator* newCollator;
        if (U_SUCCESS(status) && (newCollator = dynamic_cast<RuleBasedCollator*>(temp)) != NULL) {
            if (lenientParseRules) {
                UnicodeString rules(newCollator->getRules());
                rules.append(*lenientParseRules);

                newCollator = new RuleBasedCollator(rules, status);
                // Exit if newCollator could not be created.
                if (newCollator == NULL) {
                    return NULL;
                }
            } else {
                temp = NULL;
            }
            if (U_SUCCESS(status)) {
                newCollator->setAttribute(UCOL_DECOMPOSITION_MODE, UCOL_ON, status);
                // cast away const
                ((RuleBasedNumberFormat*)this)->collator = newCollator;
            } else {
                delete newCollator;
            }
        }
        delete temp;
    }
#endif

    // if lenient-parse mode is off, this will be null
    // (see setLenientParseMode())
    return collator;
}